

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O3

block * gen_pppoes(compiler_state_t *cstate,int sess_num)

{
  u_int uVar1;
  u_int uVar2;
  int iVar3;
  u_int uVar4;
  block *b0;
  block *b1;
  
  b0 = gen_linktype(cstate,0x8864);
  b1 = b0;
  if (-1 < sess_num) {
    b1 = gen_ncmp(cstate,OR_LINKPL,0,0,0xffff,0x10,0,sess_num);
    gen_and(b0,b1);
  }
  cstate->prevlinktype = cstate->linktype;
  uVar1 = (cstate->off_linkhdr).constant_part;
  (cstate->off_prevlinkhdr).is_variable = (cstate->off_linkhdr).is_variable;
  (cstate->off_prevlinkhdr).constant_part = uVar1;
  (cstate->off_prevlinkhdr).reg = (cstate->off_linkhdr).reg;
  cstate->linktype = 9;
  (cstate->off_linkhdr).is_variable = (cstate->off_linkpl).is_variable;
  uVar1 = (cstate->off_linkpl).constant_part;
  uVar2 = cstate->off_nl;
  (cstate->off_linkhdr).constant_part = uVar2 + 6 + uVar1;
  iVar3 = (cstate->off_linkpl).reg;
  (cstate->off_linkhdr).reg = iVar3;
  cstate->is_geneve = 0;
  (cstate->off_linktype).reg = iVar3;
  uVar4 = (cstate->off_linkhdr).constant_part;
  (cstate->off_linktype).is_variable = (cstate->off_linkhdr).is_variable;
  (cstate->off_linktype).constant_part = uVar4;
  (cstate->off_linkpl).constant_part = uVar2 + 8 + uVar1;
  cstate->off_nl = 0;
  cstate->off_nl_nosnap = 0;
  return b1;
}

Assistant:

struct block *
gen_pppoes(compiler_state_t *cstate, int sess_num)
{
	struct block *b0, *b1;

	/*
	 * Test against the PPPoE session link-layer type.
	 */
	b0 = gen_linktype(cstate, (bpf_int32)ETHERTYPE_PPPOES);

	/* If a specific session is requested, check PPPoE session id */
	if (sess_num >= 0) {
		b1 = gen_mcmp(cstate, OR_LINKPL, 0, BPF_W,
		    (bpf_int32)sess_num, 0x0000ffff);
		gen_and(b0, b1);
		b0 = b1;
	}

	/*
	 * Change the offsets to point to the type and data fields within
	 * the PPP packet, and note that this is PPPoE rather than
	 * raw PPP.
	 *
	 * XXX - this is a bit of a kludge.  If we were to split the
	 * compiler into a parser that parses an expression and
	 * generates an expression tree, and a code generator that
	 * takes an expression tree (which could come from our
	 * parser or from some other parser) and generates BPF code,
	 * we could perhaps make the offsets parameters of routines
	 * and, in the handler for an "AND" node, pass to subnodes
	 * other than the PPPoE node the adjusted offsets.
	 *
	 * This would mean that "pppoes" would, instead of changing the
	 * behavior of *all* tests after it, change only the behavior
	 * of tests ANDed with it.  That would change the documented
	 * semantics of "pppoes", which might break some expressions.
	 * However, it would mean that "(pppoes and ip) or ip" would check
	 * both for VLAN-encapsulated IP and IP-over-Ethernet, rather than
	 * checking only for VLAN-encapsulated IP, so that could still
	 * be considered worth doing; it wouldn't break expressions
	 * that are of the form "pppoes and ..." which I suspect are the
	 * most common expressions involving "pppoes".  "pppoes or ..."
	 * doesn't necessarily do what the user would really want, now,
	 * as all the "or ..." tests would be done assuming PPPoE, even
	 * though the "or" could be viewed as meaning "or, if this isn't
	 * a PPPoE packet...".
	 *
	 * The "network-layer" protocol is PPPoE, which has a 6-byte
	 * PPPoE header, followed by a PPP packet.
	 *
	 * There is no HDLC encapsulation for the PPP packet (it's
	 * encapsulated in PPPoES instead), so the link-layer type
	 * starts at the first byte of the PPP packet.  For PPPoE,
	 * that offset is relative to the beginning of the total
	 * link-layer payload, including any 802.2 LLC header, so
	 * it's 6 bytes past cstate->off_nl.
	 */
	PUSH_LINKHDR(cstate, DLT_PPP, cstate->off_linkpl.is_variable,
	    cstate->off_linkpl.constant_part + cstate->off_nl + 6, /* 6 bytes past the PPPoE header */
	    cstate->off_linkpl.reg);

	cstate->off_linktype = cstate->off_linkhdr;
	cstate->off_linkpl.constant_part = cstate->off_linkhdr.constant_part + 2;

	cstate->off_nl = 0;
	cstate->off_nl_nosnap = 0;	/* no 802.2 LLC */

	return b0;
}